

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageview.cpp
# Opt level: O2

void __thiscall QtMWidgets::PageViewPrivate::invalidatePages(PageViewPrivate *this,QRect *r)

{
  int iVar1;
  int iVar2;
  
  iVar1 = PageControl::currentIndex(this->control);
  if (iVar1 != 0) {
    QWidget::move((QPoint *)(this->pages).d.ptr[(long)iVar1 + -1]);
    QWidget::hide();
  }
  iVar2 = PageControl::count(this->control);
  if (iVar1 < iVar2 + -1) {
    QWidget::move((QPoint *)(this->pages).d.ptr[(long)iVar1 + 1]);
    QWidget::hide();
  }
  QWidget::move((QPoint *)(this->pages).d.ptr[iVar1]);
  QWidget::raise();
  this->pagesPrepared = false;
  this->pagesOffset = 0;
  return;
}

Assistant:

void
PageViewPrivate::invalidatePages( const QRect & r )
{
	const int index = control->currentIndex();

	if( index != 0 )
	{
		QWidget * w = pages.at( index - 1 );

		w->move( r.topLeft() );

		w->hide();
	}

	if( index < control->count() - 1 )
	{
		QWidget * w = pages.at( index + 1 );

		w->move( r.topLeft() );

		w->hide();
	}

	pages.at( index )->move( r.topLeft() );

	control->raise();

	pagesPrepared = false;

	pagesOffset = 0;
}